

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

int fio_sock_write_buffer(int fd,fio_packet_s *packet)

{
  uintptr_t *puVar1;
  uint uVar2;
  long lVar3;
  
  lVar3 = (long)fd * 0xa8;
  uVar2 = (**(code **)(*(long *)((long)fio_data + lVar3 + 0xa8) + 8))
                    ((long)CONCAT41(fd,*(undefined1 *)((long)fio_data + lVar3 + 0x6d)),
                     *(undefined8 *)((long)fio_data + lVar3 + 0xb0),
                     (long)(packet->data).buffer + packet->offset,packet->length);
  if (0 < (int)uVar2) {
    packet->offset = packet->offset + (ulong)(uVar2 & 0x7fffffff);
    puVar1 = &packet->length;
    *puVar1 = *puVar1 - (ulong)(uVar2 & 0x7fffffff);
    if (*puVar1 == 0) {
      fio_sock_packet_rotate_unsafe((long)fd);
    }
  }
  return uVar2;
}

Assistant:

static int fio_sock_write_buffer(int fd, fio_packet_s *packet) {
  int written = fd_data(fd).rw_hooks->write(
      fd2uuid(fd), fd_data(fd).rw_udata,
      ((uint8_t *)packet->data.buffer + packet->offset), packet->length);
  if (written > 0) {
    packet->length -= written;
    packet->offset += written;
    if (!packet->length) {
      fio_sock_packet_rotate_unsafe(fd);
    }
  }
  return written;
}